

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_recv_atleast(Curl_easy *data,size_t nbytes)

{
  MQTT *pMVar1;
  CURLcode CVar2;
  size_t local_440;
  ssize_t nread;
  uchar readbuf [1024];
  size_t sStack_30;
  CURLcode result;
  size_t rlen;
  MQTT *mq;
  size_t nbytes_local;
  Curl_easy *data_local;
  
  pMVar1 = (data->req).p.mqtt;
  sStack_30 = Curl_dyn_len(&pMVar1->recvbuf);
  if (sStack_30 < nbytes) {
    readbuf._1020_4_ = Curl_xfer_recv(data,(char *)&nread,nbytes - sStack_30,(ssize_t *)&local_440);
    if (readbuf._1020_4_ != CURLE_OK) {
      return readbuf._1020_4_;
    }
    CVar2 = Curl_dyn_addn(&pMVar1->recvbuf,&nread,local_440);
    if (CVar2 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
    sStack_30 = Curl_dyn_len(&pMVar1->recvbuf);
  }
  data_local._4_4_ = CURLE_AGAIN;
  if (nbytes <= sStack_30) {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_recv_atleast(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = data->req.p.mqtt;
  size_t rlen = Curl_dyn_len(&mq->recvbuf);
  CURLcode result;

  if(rlen < nbytes) {
    unsigned char readbuf[1024];
    ssize_t nread;

    DEBUGASSERT(nbytes - rlen < sizeof(readbuf));
    result = Curl_xfer_recv(data, (char *)readbuf, nbytes - rlen, &nread);
    if(result)
      return result;
    DEBUGASSERT(nread >= 0);
    if(Curl_dyn_addn(&mq->recvbuf, readbuf, (size_t)nread))
      return CURLE_OUT_OF_MEMORY;
    rlen = Curl_dyn_len(&mq->recvbuf);
  }
  return (rlen >= nbytes) ? CURLE_OK : CURLE_AGAIN;
}